

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_method_seek(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  IOFileUD *pIVar4;
  TValue *L_00;
  __off64_t _Var5;
  lua_State *in_RDI;
  int res;
  cTValue *o;
  int64_t ofs;
  int opt;
  FILE *fp;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  __off64_t local_38;
  undefined4 in_stack_ffffffffffffffd0;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pIVar4 = io_tofile(in_stack_ffffffffffffffc0);
  __stream = (FILE *)pIVar4->fp;
  iVar2 = lj_lib_checkopt((lua_State *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                          ,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(char *)__stream);
  local_38 = 0;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else if (iVar2 == 1) {
    iVar2 = 1;
  }
  else if (iVar2 == 2) {
    iVar2 = 2;
  }
  pTVar1 = in_RDI->base;
  L_00 = pTVar1 + 2;
  if (L_00 < in_RDI->top) {
    if (*(uint *)((long)pTVar1 + 0x14) < 0xfffeffff) {
      local_38 = (__off64_t)L_00->n;
    }
    else if (*(int *)((long)pTVar1 + 0x14) != -1) {
      lj_err_argt((lua_State *)&L_00->field_2,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  iVar3 = fseeko64(__stream,local_38,iVar2);
  if (iVar3 == 0) {
    _Var5 = ftello64(__stream);
    in_RDI->top[-1].n = (double)_Var5;
    iVar2 = 1;
  }
  else {
    iVar2 = luaL_fileresult(in_RDI,(int)((ulong)__stream >> 0x20),
                            (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  }
  return iVar2;
}

Assistant:

LJLIB_CF(io_method_seek)
{
  FILE *fp = io_tofile(L)->fp;
  int opt = lj_lib_checkopt(L, 2, 1, "\3set\3cur\3end");
  int64_t ofs = 0;
  cTValue *o;
  int res;
  if (opt == 0) opt = SEEK_SET;
  else if (opt == 1) opt = SEEK_CUR;
  else if (opt == 2) opt = SEEK_END;
  o = L->base+2;
  if (o < L->top) {
    if (tvisint(o))
      ofs = (int64_t)intV(o);
    else if (tvisnum(o))
      ofs = (int64_t)numV(o);
    else if (!tvisnil(o))
      lj_err_argt(L, 3, LUA_TNUMBER);
  }
#if LJ_TARGET_POSIX
  res = fseeko(fp, ofs, opt);
#elif _MSC_VER >= 1400
  res = _fseeki64(fp, ofs, opt);
#elif defined(__MINGW32__)
  res = fseeko64(fp, ofs, opt);
#else
  res = fseek(fp, (long)ofs, opt);
#endif
  if (res)
    return luaL_fileresult(L, 0, NULL);
#if LJ_TARGET_POSIX
  ofs = ftello(fp);
#elif _MSC_VER >= 1400
  ofs = _ftelli64(fp);
#elif defined(__MINGW32__)
  ofs = ftello64(fp);
#else
  ofs = (int64_t)ftell(fp);
#endif
  setint64V(L->top-1, ofs);
  return 1;
}